

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_isdir(char *args)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  PHYSFS_Stat statbuf;
  
  pcVar3 = args;
  if (*args == '\"') {
    pcVar3 = args + 1;
    sVar2 = strlen(pcVar3);
    args[sVar2] = '\0';
  }
  iVar1 = PHYSFS_stat(pcVar3,&statbuf);
  pcVar3 = "is";
  if (statbuf.filetype != PHYSFS_FILETYPE_DIRECTORY) {
    pcVar3 = "is NOT";
  }
  if (iVar1 == 0) {
    pcVar3 = "is NOT";
  }
  printf("File %s a directory.\n",pcVar3);
  return 1;
}

Assistant:

static int cmd_isdir(char *args)
{
    PHYSFS_Stat statbuf;
    int rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_stat(args, &statbuf);
    if (rc)
        rc = (statbuf.filetype == PHYSFS_FILETYPE_DIRECTORY);
    printf("File %s a directory.\n", rc ? "is" : "is NOT");
    return 1;
}